

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O0

bool libwebm::ParseVpxCodecPrivate(uint8_t *private_data,int32_t length,Vp9CodecFeatures *features)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int priv_profile_2;
  int priv_profile_1;
  int i;
  int levels [14];
  int kNumLevels;
  int priv_level;
  int priv_profile;
  uint8_t length_byte;
  uint8_t id_byte;
  int offset;
  int kVpxFeatureLength;
  uint8_t kVp9ChromaSubsamplingId;
  uint8_t kVp9BitDepthId;
  uint8_t kVp9LevelId;
  uint8_t kVp9ProfileId;
  int kVpxCodecPrivateMinLength;
  Vp9CodecFeatures *features_local;
  int32_t length_local;
  uint8_t *private_data_local;
  
  if (((private_data == (uint8_t *)0x0) || (features == (Vp9CodecFeatures *)0x0)) || (length < 3)) {
    private_data_local._7_1_ = false;
  }
  else {
    priv_profile = 0;
    features->profile = 0x7fffffff;
    features->level = 0x7fffffff;
    features->bit_depth = 0x7fffffff;
    features->chroma_subsampling = 0x7fffffff;
    do {
      iVar2 = priv_profile;
      uVar1 = private_data[priv_profile];
      iVar4 = priv_profile + 2;
      if (private_data[priv_profile + 1] != '\x01') {
        return false;
      }
      if (uVar1 == '\x01') {
        uVar3 = (uint)private_data[iVar4];
        if (3 < uVar3) {
          return false;
        }
        if ((features->profile != 0x7fffffff) && (features->profile != uVar3)) {
          return false;
        }
        features->profile = uVar3;
      }
      else if (uVar1 == '\x02') {
        uVar3 = (uint)private_data[iVar4];
        memcpy(&priv_profile_1,&DAT_0016b900,0x38);
        for (priv_profile_2 = 0; priv_profile_2 < 0xe; priv_profile_2 = priv_profile_2 + 1) {
          if (uVar3 == (&priv_profile_1)[priv_profile_2]) {
            if ((features->level != 0x7fffffff) && (features->level != uVar3)) {
              return false;
            }
            features->level = uVar3;
            break;
          }
        }
        if (features->level == 0x7fffffff) {
          return false;
        }
      }
      else if (uVar1 == '\x03') {
        uVar3 = (uint)private_data[iVar4];
        if (((uVar3 != 8) && (uVar3 != 10)) && (uVar3 != 0xc)) {
          return false;
        }
        if ((features->bit_depth != 0x7fffffff) && (features->bit_depth != uVar3)) {
          return false;
        }
        features->bit_depth = uVar3;
      }
      else {
        if (uVar1 != '\x04') {
          return false;
        }
        uVar3 = (uint)private_data[iVar4];
        if (((uVar3 != 0) && (uVar3 != 1)) && ((uVar3 != 2 && (uVar3 != 3)))) {
          return false;
        }
        if ((features->chroma_subsampling != 0x7fffffff) && (features->chroma_subsampling != uVar3))
        {
          return false;
        }
        features->chroma_subsampling = uVar3;
      }
      priv_profile = priv_profile + 3;
    } while (iVar2 + 6 <= length);
    private_data_local._7_1_ = true;
  }
  return private_data_local._7_1_;
}

Assistant:

bool ParseVpxCodecPrivate(const uint8_t* private_data, int32_t length,
                          Vp9CodecFeatures* features) {
  const int kVpxCodecPrivateMinLength = 3;
  if (!private_data || !features || length < kVpxCodecPrivateMinLength)
    return false;

  const uint8_t kVp9ProfileId = 1;
  const uint8_t kVp9LevelId = 2;
  const uint8_t kVp9BitDepthId = 3;
  const uint8_t kVp9ChromaSubsamplingId = 4;
  const int kVpxFeatureLength = 1;
  int offset = 0;

  // Set features to not set.
  features->profile = Vp9CodecFeatures::kValueNotPresent;
  features->level = Vp9CodecFeatures::kValueNotPresent;
  features->bit_depth = Vp9CodecFeatures::kValueNotPresent;
  features->chroma_subsampling = Vp9CodecFeatures::kValueNotPresent;
  do {
    const uint8_t id_byte = private_data[offset++];
    const uint8_t length_byte = private_data[offset++];
    if (length_byte != kVpxFeatureLength)
      return false;
    if (id_byte == kVp9ProfileId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile < 0 || priv_profile > 3)
        return false;
      if (features->profile != Vp9CodecFeatures::kValueNotPresent &&
          features->profile != priv_profile) {
        return false;
      }
      features->profile = priv_profile;
    } else if (id_byte == kVp9LevelId) {
      const int priv_level = static_cast<int>(private_data[offset++]);

      const int kNumLevels = 14;
      const int levels[kNumLevels] = {10, 11, 20, 21, 30, 31, 40,
                                      41, 50, 51, 52, 60, 61, 62};

      for (int i = 0; i < kNumLevels; ++i) {
        if (priv_level == levels[i]) {
          if (features->level != Vp9CodecFeatures::kValueNotPresent &&
              features->level != priv_level) {
            return false;
          }
          features->level = priv_level;
          break;
        }
      }
      if (features->level == Vp9CodecFeatures::kValueNotPresent)
        return false;
    } else if (id_byte == kVp9BitDepthId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile != 8 && priv_profile != 10 && priv_profile != 12)
        return false;
      if (features->bit_depth != Vp9CodecFeatures::kValueNotPresent &&
          features->bit_depth != priv_profile) {
        return false;
      }
      features->bit_depth = priv_profile;
    } else if (id_byte == kVp9ChromaSubsamplingId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile != 0 && priv_profile != 1 && priv_profile != 2 &&
          priv_profile != 3)
        return false;
      if (features->chroma_subsampling != Vp9CodecFeatures::kValueNotPresent &&
          features->chroma_subsampling != priv_profile) {
        return false;
      }
      features->chroma_subsampling = priv_profile;
    } else {
      // Invalid ID.
      return false;
    }
  } while (offset + kVpxCodecPrivateMinLength <= length);

  return true;
}